

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

ExpectedValue * spectest::GetLane(ExpectedValue *__return_storage_ptr__,ExpectedValue *ev,int lane)

{
  Index IVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  Enum EVar5;
  uint32_t val;
  uint64_t val_00;
  float val_01;
  double val_02;
  uint64_t local_40;
  uint32_t local_34;
  undefined1 local_30 [8];
  v128 vec;
  int lane_count;
  int lane_local;
  ExpectedValue *ev_local;
  
  vec.v._8_8_ = ev->lane_type;
  iVar4 = LaneCountFromType((Type)vec.v._8_8_);
  EVar5 = wabt::Type::operator_cast_to_Enum((Type *)ev);
  if (EVar5 != V128) {
    __assert_fail("ev.value.type == Type::V128",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                  ,0xc1,"ExpectedValue spectest::GetLane(const ExpectedValue &, int)");
  }
  if (lane < iVar4) {
    ExpectedValue::ExpectedValue(__return_storage_ptr__);
    IVar1 = (ev->lane_type).type_index_;
    (__return_storage_ptr__->value).type.enum_ = (ev->lane_type).enum_;
    (__return_storage_ptr__->value).type.type_index_ = IVar1;
    _local_30 = wabt::interp::Value::Get<v128>(&(ev->value).value);
    EVar5 = wabt::Type::operator_cast_to_Enum(&ev->lane_type);
    switch(EVar5) {
    case I16:
      __return_storage_ptr__->nan[0] = None;
      uVar3 = v128::u16((v128 *)local_30,lane);
      wabt::interp::Value::Set<unsigned_int>(&(__return_storage_ptr__->value).value,(uint)uVar3);
      break;
    case I8:
      __return_storage_ptr__->nan[0] = None;
      bVar2 = v128::u8((v128 *)local_30,lane);
      wabt::interp::Value::Set<unsigned_int>(&(__return_storage_ptr__->value).value,(uint)bVar2);
      break;
    default:
      abort();
    case F64:
      __return_storage_ptr__->nan[0] = ev->nan[lane];
      local_40 = v128::f64_bits((v128 *)local_30,lane);
      val_02 = wabt::Bitcast<double,unsigned_long>(&local_40);
      wabt::interp::Value::Set<double>(&(__return_storage_ptr__->value).value,(f64)val_02);
      break;
    case F32:
      __return_storage_ptr__->nan[0] = ev->nan[lane];
      local_34 = v128::f32_bits((v128 *)local_30,lane);
      val_01 = wabt::Bitcast<float,unsigned_int>(&local_34);
      wabt::interp::Value::Set<float>(&(__return_storage_ptr__->value).value,(f32)val_01);
      break;
    case I64:
      __return_storage_ptr__->nan[0] = None;
      val_00 = v128::u64((v128 *)local_30,lane);
      wabt::interp::Value::Set<unsigned_long>(&(__return_storage_ptr__->value).value,val_00);
      break;
    case I32:
      __return_storage_ptr__->nan[0] = None;
      val = v128::u32((v128 *)local_30,lane);
      wabt::interp::Value::Set<unsigned_int>(&(__return_storage_ptr__->value).value,val);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("lane < lane_count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                ,0xc2,"ExpectedValue spectest::GetLane(const ExpectedValue &, int)");
}

Assistant:

ExpectedValue GetLane(const ExpectedValue& ev, int lane) {
  int lane_count = LaneCountFromType(ev.lane_type);
  assert(ev.value.type == Type::V128);
  assert(lane < lane_count);

  ExpectedValue result;
  result.value.type = ev.lane_type;

  v128 vec = ev.value.value.Get<v128>();

  switch (ev.lane_type) {
    case Type::I8:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u32>(vec.u8(lane));
      break;

    case Type::I16:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u32>(vec.u16(lane));
      break;

    case Type::I32:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u32>(vec.u32(lane));
      break;

    case Type::I64:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u64>(vec.u64(lane));
      break;

    case Type::F32:
      result.nan[0] = ev.nan[lane];
      result.value.value.Set<f32>(Bitcast<f32>(vec.f32_bits(lane)));
      break;

    case Type::F64:
      result.nan[0] = ev.nan[lane];
      result.value.value.Set<f64>(Bitcast<f64>(vec.f64_bits(lane)));
      break;

    default:
      WABT_UNREACHABLE;
  }
  return result;
}